

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O1

void __thiscall QIcon::addFile(QIcon *this,QString *fileName,QSize *size,Mode mode,State state)

{
  QIconEngine *pQVar1;
  undefined1 *puVar2;
  qreal __x;
  double dVar3;
  QBasicAtomicInt *pQVar4;
  Data *pDVar5;
  qsizetype qVar6;
  QIconEngine QVar7;
  Data *pDVar8;
  char cVar9;
  int iVar10;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_> *this_00;
  Type *pTVar11;
  long *plVar12;
  QPixmapIconEngine *this_01;
  QIconPrivate *pQVar13;
  byte bVar14;
  QPixmapIconEngine *this_02;
  long lVar15;
  QPixmapIconEngineEntry *pQVar16;
  long lVar17;
  long lVar18;
  long in_FS_OFFSET;
  bool bVar19;
  QStringView QVar20;
  QStringView QVar21;
  QLatin1String QVar22;
  QStringView QVar23;
  QFileInfo info;
  qreal sourceDevicePixelRatio;
  QVarLengthArray<int,_4LL> devicePixelRatios;
  QString local_b8;
  undefined1 local_98 [8];
  QPixmapIconEngine local_90;
  QPixmapIconEngine local_68;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fileName->d).size == 0) goto LAB_0027233b;
  detach(this);
  if (this->d == (QIconPrivate *)0x0) {
    local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_b8,fileName);
    this_01 = &local_68;
    local_68.pixmaps.d.ptr = (QPixmapIconEngineEntry *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.super_QIconEngine._vptr_QIconEngine = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_68.pixmaps.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    this_02 = this_01;
    QFileInfo::suffix();
    if (local_68.pixmaps.d.ptr == (QPixmapIconEngineEntry *)0x0) {
      QMimeDatabase::QMimeDatabase((QMimeDatabase *)local_98);
      this_01 = (QPixmapIconEngine *)(local_98 + 8);
      QMimeDatabase::mimeTypeForFile(this_01,(QMimeDatabase *)local_98,&local_b8,0);
      QMimeType::preferredSuffix();
      pDVar8 = local_68.pixmaps.d.d;
      QVar7._vptr_QIconEngine = local_68.super_QIconEngine._vptr_QIconEngine;
      qVar6 = local_90.pixmaps.d.size;
      pDVar5 = local_90.pixmaps.d.d;
      local_90.pixmaps.d.d = (Data *)local_68.super_QIconEngine._vptr_QIconEngine;
      local_68.super_QIconEngine._vptr_QIconEngine = (_func_int **)pDVar5;
      local_68.pixmaps.d.d = (Data *)local_90.pixmaps.d.ptr;
      local_90.pixmaps.d.ptr = (QPixmapIconEngineEntry *)pDVar8;
      local_90.pixmaps.d.size = (qsizetype)local_68.pixmaps.d.ptr;
      local_68.pixmaps.d.ptr = (QPixmapIconEngineEntry *)qVar6;
      if ((QArrayData *)QVar7._vptr_QIconEngine != (QArrayData *)0x0) {
        LOCK();
        *(int *)QVar7._vptr_QIconEngine = *(int *)QVar7._vptr_QIconEngine + -1;
        UNLOCK();
        if (*(int *)QVar7._vptr_QIconEngine == 0) {
          QArrayData::deallocate((QArrayData *)QVar7._vptr_QIconEngine,2,0x10);
        }
      }
      QMimeType::~QMimeType((QMimeType *)(local_98 + 8));
      this_02 = (QPixmapIconEngine *)local_98;
      QMimeDatabase::~QMimeDatabase((QMimeDatabase *)this_02);
    }
    if (local_68.pixmaps.d.ptr == (QPixmapIconEngineEntry *)0x0) {
LAB_00271fa8:
      this_01 = (QPixmapIconEngine *)0x0;
    }
    else {
      this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_> *)
                QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_>::
                operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_>
                            *)this_02);
      iVar10 = QFactoryLoader::indexOf((QString *)this_00);
      if (iVar10 == -1) {
        bVar19 = true;
      }
      else {
        pTVar11 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_>::
                  operator()(this_00);
        QFactoryLoader::instance((int)pTVar11);
        plVar12 = (long *)QMetaObject::cast((QObject *)&QIconEnginePlugin::staticMetaObject);
        bVar19 = plVar12 == (long *)0x0;
        if (!bVar19) {
          this_01 = (QPixmapIconEngine *)(**(code **)(*plVar12 + 0x60))(plVar12,fileName);
          bVar19 = false;
        }
      }
      if (bVar19) goto LAB_00271fa8;
    }
    if (this_01 == (QPixmapIconEngine *)0x0) {
      bVar14 = 0;
    }
    else {
      iVar10 = (*(this_01->super_QIconEngine)._vptr_QIconEngine[0xd])(this_01);
      bVar14 = (byte)iVar10 ^ 1;
    }
    pQVar13 = (QIconPrivate *)operator_new(0x18);
    if (this_01 == (QPixmapIconEngine *)0x0) {
      this_01 = (QPixmapIconEngine *)operator_new(0x20);
      QPixmapIconEngine::QPixmapIconEngine(this_01);
    }
    pQVar13->engine = &this_01->super_QIconEngine;
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    LOCK();
    UNLOCK();
    iVar10 = nextSerialNumCounter()::serial + 1;
    nextSerialNumCounter()::serial = nextSerialNumCounter()::serial + 1;
    pQVar13->serialNum = iVar10;
    pQVar13->detach_no = 0;
    pQVar13->is_mask = false;
    this->d = pQVar13;
    if ((QArrayData *)local_68.super_QIconEngine._vptr_QIconEngine != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_68.super_QIconEngine._vptr_QIconEngine =
           *(int *)local_68.super_QIconEngine._vptr_QIconEngine + -1;
      UNLOCK();
      if (*(int *)local_68.super_QIconEngine._vptr_QIconEngine == 0) {
        QArrayData::deallocate((QArrayData *)local_68.super_QIconEngine._vptr_QIconEngine,2,0x10);
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_b8);
    if (bVar14 == 0) goto LAB_00272046;
  }
  else {
LAB_00272046:
    pQVar1 = this->d->engine;
    (*pQVar1->_vptr_QIconEngine[6])(pQVar1,fileName,size,(ulong)mode,(ulong)state);
  }
  (*this->d->engine->_vptr_QIconEngine[7])(&local_68);
  if (local_68.pixmaps.d.ptr == (QPixmapIconEngineEntry *)0x3) {
    QVar20.m_data = (storage_type_conflict *)local_68.pixmaps.d.d;
    QVar20.m_size = 3;
    QVar22.m_data = "svg";
    QVar22.m_size = 3;
    cVar9 = QtPrivate::equalStrings(QVar20,QVar22);
  }
  else {
    cVar9 = '\0';
  }
  if ((QArrayData *)local_68.super_QIconEngine._vptr_QIconEngine != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_68.super_QIconEngine._vptr_QIconEngine =
         *(int *)local_68.super_QIconEngine._vptr_QIconEngine + -1;
    UNLOCK();
    if (*(int *)local_68.super_QIconEngine._vptr_QIconEngine == 0) {
      QArrayData::deallocate((QArrayData *)local_68.super_QIconEngine._vptr_QIconEngine,2,0x10);
    }
  }
  if (cVar9 == '\0') {
    local_68.pixmaps.d.ptr = (QPixmapIconEngineEntry *)&local_68.pixmaps.d.size;
    local_68.pixmaps.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_68.super_QIconEngine._vptr_QIconEngine = (_func_int **)0x4;
    local_68.pixmaps.d.d = (Data *)0x0;
    local_90.pixmaps.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_90.pixmaps.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_90.pixmaps.d.ptr = (QPixmapIconEngineEntry *)&DAT_aaaaaaaaaaaaaaaa;
    QGuiApplication::screens();
    if ((QPixmapIconEngineEntry *)local_90.pixmaps.d.size != (QPixmapIconEngineEntry *)0x0) {
      pQVar4 = (QBasicAtomicInt *)&(local_90.pixmaps.d.ptr)->pixmap;
      lVar17 = local_90.pixmaps.d.size * 2;
      pQVar16 = local_90.pixmaps.d.ptr;
      do {
        __x = QScreen::devicePixelRatio
                        (*(QScreen **)
                          &(((QArrayData *)pQVar16)->ref_)._q_value.super___atomic_base<int>);
        dVar3 = ceil(__x);
        iVar10 = (int)dVar3;
        local_90.super_QIconEngine._vptr_QIconEngine._0_4_ = iVar10;
        if (0 < iVar10) {
          lVar18 = (long)local_68.pixmaps.d.d * 4;
          do {
            lVar15 = lVar18;
            if (lVar15 == 0) goto LAB_0027218b;
            lVar18 = lVar15 + -4;
          } while (*(int *)((long)local_68.pixmaps.d.ptr + lVar15 + -4) != iVar10);
          if (lVar15 == 0) {
LAB_0027218b:
            if (local_68.pixmaps.d.d == (Data *)local_68.super_QIconEngine._vptr_QIconEngine) {
              local_b8.d.d = (Data *)CONCAT44(local_b8.d.d._4_4_,iVar10);
              QVLABase<int>::emplace_back_impl<int>
                        ((QVLABase<int> *)&local_68,4,&local_68.pixmaps.d.size,(int *)&local_b8);
            }
            else {
              QVLABase<int>::emplace_back_impl<int_const&>
                        ((QVLABase<int> *)&local_68,4,&local_68.pixmaps.d.size,(int *)(local_98 + 8)
                        );
            }
          }
        }
        pQVar16 = (QPixmapIconEngineEntry *)&((QArrayData *)pQVar16)->alloc;
      } while (pQVar16 != (QPixmapIconEngineEntry *)(pQVar4 + lVar17));
    }
    pQVar16 = local_68.pixmaps.d.ptr;
    if (&(local_68.pixmaps.d.d)->super_QArrayData != (QArrayData *)0x0) {
      puVar2 = (undefined1 *)
               ((long)&((local_68.pixmaps.d.ptr)->pixmap).super_QPaintDevice._vptr_QPaintDevice +
               (long)local_68.pixmaps.d.d * 4);
      lVar17 = 0x3f;
      if (&(local_68.pixmaps.d.d)->super_QArrayData != (QArrayData *)0x0) {
        for (; (ulong)local_68.pixmaps.d.d >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                (local_68.pixmaps.d.ptr,puVar2,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                (pQVar16,puVar2);
    }
    pQVar16 = local_68.pixmaps.d.ptr;
    local_90.super_QIconEngine._vptr_QIconEngine = (_func_int **)0x7fefffffffffffff;
    if (&(local_68.pixmaps.d.d)->super_QArrayData != (QArrayData *)0x0) {
      lVar18 = (long)local_68.pixmaps.d.d << 2;
      lVar17 = 0;
      do {
        dVar3 = (double)*(int *)((long)&(pQVar16->pixmap).super_QPaintDevice._vptr_QPaintDevice +
                                lVar17);
        if (dVar3 < (double)local_90.super_QIconEngine._vptr_QIconEngine) {
          local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          qt_findAtNxFile(&local_b8,fileName,dVar3,(qreal *)(local_98 + 8));
          puVar2 = (undefined1 *)(fileName->d).size;
          if ((undefined1 *)local_b8.d.size == puVar2) {
            QVar21.m_data = local_b8.d.ptr;
            QVar21.m_size = local_b8.d.size;
            QVar23.m_data = (fileName->d).ptr;
            QVar23.m_size = (qsizetype)puVar2;
            cVar9 = QtPrivate::equalStrings(QVar21,QVar23);
            if (cVar9 == '\0') goto LAB_002722a3;
          }
          else {
LAB_002722a3:
            pQVar1 = this->d->engine;
            (*pQVar1->_vptr_QIconEngine[6])(pQVar1,&local_b8,size,(ulong)mode,(ulong)state);
          }
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        lVar17 = lVar17 + 4;
      } while (lVar18 != lVar17);
    }
    if ((QPixmapIconEngineEntry *)local_90.pixmaps.d.d != (QPixmapIconEngineEntry *)0x0) {
      LOCK();
      ((__atomic_base<int> *)
      &(((QPixmap *)&(local_90.pixmaps.d.d)->super_QArrayData)->super_QPaintDevice).
       _vptr_QPaintDevice)->_M_i =
           ((__atomic_base<int> *)
           &(((QPixmap *)&(local_90.pixmaps.d.d)->super_QArrayData)->super_QPaintDevice).
            _vptr_QPaintDevice)->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)
          &(((QPixmap *)&(local_90.pixmaps.d.d)->super_QArrayData)->super_QPaintDevice).
           _vptr_QPaintDevice)->_M_i == 0) {
        QArrayData::deallocate(&(local_90.pixmaps.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (local_68.pixmaps.d.ptr != (QPixmapIconEngineEntry *)&local_68.pixmaps.d.size) {
      QtPrivate::sizedFree
                (local_68.pixmaps.d.ptr,(long)local_68.super_QIconEngine._vptr_QIconEngine << 2);
    }
  }
LAB_0027233b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIcon::addFile(const QString &fileName, const QSize &size, Mode mode, State state)
{
    if (fileName.isEmpty())
        return;
    detach();
    bool alreadyAdded = false;
    if (!d) {

        QFileInfo info(fileName);
        QString suffix = info.suffix();
#if QT_CONFIG(mimetype)
        if (suffix.isEmpty())
            suffix = QMimeDatabase().mimeTypeForFile(info).preferredSuffix(); // determination from contents
#endif // mimetype
        QIconEngine *engine = iconEngineFromSuffix(fileName, suffix);
        if (engine)
            alreadyAdded = !engine->isNull();
        d = new QIconPrivate(engine ? engine : new QPixmapIconEngine);
    }
    if (!alreadyAdded)
        d->engine->addFile(fileName, size, mode, state);

    if (d->engine->key() == "svg"_L1)   // not needed and also not supported
        return;

    // Check if a "@Nx" file exists and add it.
    QVarLengthArray<int, 4> devicePixelRatios;
    const auto screens = qApp->screens();
    for (const auto *screen : screens) {
        const auto dpr = qCeil(screen->devicePixelRatio()); // qt_findAtNxFile only supports integer values
        if (dpr >= 1 && !devicePixelRatios.contains(dpr))
            devicePixelRatios.push_back(dpr);
    }
    std::sort(devicePixelRatios.begin(), devicePixelRatios.end(), std::greater<int>());
    qreal sourceDevicePixelRatio = std::numeric_limits<qreal>::max();
    for (const auto dpr : std::as_const(devicePixelRatios)) {
        if (dpr >= sourceDevicePixelRatio)
            continue;
        const QString atNxFileName = qt_findAtNxFile(fileName, dpr, &sourceDevicePixelRatio);
        if (atNxFileName != fileName)
            d->engine->addFile(atNxFileName, size, mode, state);
    }
}